

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O3

FT_UInt32 FT_Vector_NormLen(FT_Vector *vector)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  
  uVar1 = (uint)vector->x;
  uVar12 = -uVar1;
  if (0 < (int)uVar1) {
    uVar12 = uVar1;
  }
  uVar2 = (uint)vector->y;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if (uVar1 == 0) {
    if (uVar2 == 0) {
      return 0;
    }
    vector->y = (ulong)(~uVar2 >> 0xe & 0x20000) - 0x10000;
    return uVar3;
  }
  if (uVar2 == 0) {
    vector->x = (ulong)(~uVar1 >> 0xe & 0x20000) - 0x10000;
    return uVar12;
  }
  uVar6 = (uVar12 >> 1) + uVar3;
  if (uVar3 < uVar12) {
    uVar6 = (uVar3 >> 1) + uVar12;
  }
  uVar13 = 0x1f;
  if (uVar6 != 0) {
    for (; uVar6 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  iVar8 = ((uVar13 ^ 0x1f) - 0x10) +
          (uint)(uVar6 < (uint)(0xaaaaaaaaL >> ((byte)(uVar13 ^ 0x1f) & 0x3f)));
  bVar4 = (byte)iVar8;
  if (iVar8 < 1) {
    bVar5 = -bVar4;
    uVar12 = uVar12 >> (bVar5 & 0x1f);
    uVar3 = uVar3 >> (bVar5 & 0x1f);
    uVar6 = uVar6 >> (bVar5 & 0x1f);
  }
  else {
    uVar12 = uVar12 << (bVar4 & 0x1f);
    uVar3 = uVar3 << (bVar4 & 0x1f);
    uVar6 = (uVar12 >> 1) + uVar3;
    if (uVar3 < uVar12) {
      uVar6 = (uVar3 >> 1) + uVar12;
    }
  }
  iVar14 = 0x10000 - uVar6;
  do {
    uVar6 = ((int)(iVar14 * uVar12) >> 0x10) + uVar12;
    uVar13 = ((int)(iVar14 * uVar3) >> 0x10) + uVar3;
    iVar9 = uVar6 * uVar6 + uVar13 * uVar13;
    iVar7 = uVar6 * uVar6 + uVar13 * uVar13 + 0x1ff;
    if (-1 < iVar9) {
      iVar7 = iVar9;
    }
    uVar10 = (iVar14 + 0x10000 >> 8) * -(iVar7 >> 9);
    iVar14 = (uVar10 >> 0x10) + iVar14;
  } while (0xffff < (int)uVar10);
  uVar11 = -(ulong)uVar6;
  if (-1 < (int)uVar1) {
    uVar11 = (ulong)uVar6;
  }
  uVar15 = -(ulong)uVar13;
  if (-1 < (int)uVar2) {
    uVar15 = (ulong)uVar13;
  }
  iVar7 = uVar12 * uVar6 + uVar3 * uVar13;
  iVar14 = uVar12 * uVar6 + 0xffff + uVar3 * uVar13;
  if (-1 < iVar7) {
    iVar14 = iVar7;
  }
  iVar14 = (iVar14 >> 0x10) + 0x10000;
  vector->x = uVar11;
  vector->y = uVar15;
  if (iVar8 < 1) {
    return iVar14 << (-bVar4 & 0x1f);
  }
  return (uint)(iVar14 + (1 << (bVar4 - 1 & 0x1f))) >> (bVar4 & 0x1f);
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Vector_NormLen( FT_Vector*  vector )
  {
    FT_Int32   x_ = vector->x;
    FT_Int32   y_ = vector->y;
    FT_Int32   b, z;
    FT_UInt32  x, y, u, v, l;
    FT_Int     sx = 1, sy = 1, shift;


    x = (FT_UInt32)x_;
    y = (FT_UInt32)y_;

    FT_MOVE_SIGN( x_, x, sx );
    FT_MOVE_SIGN( y_, y, sy );

    /* trivial cases */
    if ( x == 0 )
    {
      if ( y > 0 )
        vector->y = sy * 0x10000;
      return y;
    }
    else if ( y == 0 )
    {
      if ( x > 0 )
        vector->x = sx * 0x10000;
      return x;
    }

    /* Estimate length and prenormalize by shifting so that */
    /* the new approximate length is between 2/3 and 4/3.   */
    /* The magic constant 0xAAAAAAAAUL (2/3 of 2^32) helps  */
    /* achieve this in 16.16 fixed-point representation.    */
    l = x > y ? x + ( y >> 1 )
              : y + ( x >> 1 );

    shift  = 31 - FT_MSB( l );
    shift -= 15 + ( l >= ( 0xAAAAAAAAUL >> shift ) );

    if ( shift > 0 )
    {
      x <<= shift;
      y <<= shift;

      /* re-estimate length for tiny vectors */
      l = x > y ? x + ( y >> 1 )
                : y + ( x >> 1 );
    }
    else
    {
      x >>= -shift;
      y >>= -shift;
      l >>= -shift;
    }

    /* lower linear approximation for reciprocal length minus one */
    b = 0x10000 - (FT_Int32)l;

    x_ = (FT_Int32)x;
    y_ = (FT_Int32)y;

    /* Newton's iterations */
    do
    {
      u = (FT_UInt32)( x_ + ( x_ * b >> 16 ) );
      v = (FT_UInt32)( y_ + ( y_ * b >> 16 ) );

      /* Normalized squared length in the parentheses approaches 2^32. */
      /* On two's complement systems, converting to signed gives the   */
      /* difference with 2^32 even if the expression wraps around.     */
      z = -(FT_Int32)( u * u + v * v ) / 0x200;
      z = z * ( ( 0x10000 + b ) >> 8 ) / 0x10000;

      b += z;

    } while ( z > 0 );

    vector->x = sx < 0 ? -(FT_Pos)u : (FT_Pos)u;
    vector->y = sy < 0 ? -(FT_Pos)v : (FT_Pos)v;

    /* Conversion to signed helps to recover from likely wrap around */
    /* in calculating the prenormalized length, because it gives the */
    /* correct difference with 2^32 on two's complement systems.     */
    l = (FT_UInt32)( 0x10000 + (FT_Int32)( u * x + v * y ) / 0x10000 );
    if ( shift > 0 )
      l = ( l + ( 1 << ( shift - 1 ) ) ) >> shift;
    else
      l <<= -shift;

    return l;
  }